

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O3

bool __thiscall ArmParser::parseRegisterList(ArmParser *this,Parser *parser,int *dest,int validMask)

{
  bool bVar1;
  bool bVar2;
  Token *pTVar3;
  uint uVar4;
  uint uVar5;
  Tokenizer *this_00;
  ArmRegisterValue reg;
  ArmRegisterValue reg2;
  ArmRegisterValue local_80;
  ArmRegisterValue local_58;
  
  local_80.name._name._M_dataplus._M_p = (pointer)&local_80.name._name.field_2;
  local_80.name._name.field_2._M_allocated_capacity = 0;
  local_80.name._name.field_2._8_8_ = 0;
  local_80.name._name._M_string_length = 0;
  local_58.name._name._M_dataplus._M_p = (pointer)&local_58.name._name.field_2;
  local_58.name._name.field_2._M_allocated_capacity = 0;
  local_58.name._name.field_2._8_8_ = 0;
  local_58.name._name._M_string_length = 0;
  *dest = 0;
  do {
    bVar1 = parseRegisterTable(this,parser,&local_80,armRegisters,0x13);
    if (!bVar1 || 0xf < local_80.num) {
      bVar1 = false;
LAB_00160331:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.name._name._M_dataplus._M_p != &local_58.name._name.field_2) {
        operator_delete(local_58.name._name._M_dataplus._M_p,
                        local_58.name._name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.name._name._M_dataplus._M_p != &local_80.name._name.field_2) {
        operator_delete(local_80.name._name._M_dataplus._M_p,
                        local_80.name._name.field_2._M_allocated_capacity + 1);
      }
      return bVar1;
    }
    pTVar3 = Tokenizer::peekToken
                       ((parser->entries).
                        super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
    if (pTVar3->type == Minus) {
      this_00 = (parser->entries).
                super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
                super__Vector_impl_data._M_finish[-1].tokenizer;
      Tokenizer::eatTokens(this_00,1);
      bVar2 = parseRegisterTable((ArmParser *)this_00,parser,&local_58,armRegisters,0x13);
      bVar1 = false;
      if (((!bVar2) || (bVar1 = false, 0xf < local_58.num)) || (local_58.num < local_80.num))
      goto LAB_00160331;
      uVar4 = *dest;
      uVar5 = local_80.num;
      do {
        uVar4 = uVar4 | 1 << (uVar5 & 0x1f);
        uVar5 = uVar5 + 1;
      } while (local_58.num + 1U != uVar5);
    }
    else {
      uVar4 = *dest | 1 << (local_80.num & 0x1fU);
    }
    *dest = uVar4;
    pTVar3 = Tokenizer::peekToken
                       ((parser->entries).
                        super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
    if (pTVar3->type != Comma) {
      bVar1 = (*dest & ~validMask) == 0;
      goto LAB_00160331;
    }
    this = (ArmParser *)
           (parser->entries).
           super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].tokenizer;
    Tokenizer::eatTokens((Tokenizer *)this,1);
  } while( true );
}

Assistant:

bool ArmParser::parseRegisterList(Parser& parser, int& dest, int validMask)
{
	ArmRegisterValue reg, reg2;

	dest = 0;
	while (true)
	{
		if (!parseRegister(parser,reg))
			return false;

		if (parser.peekToken().type == TokenType::Minus)
		{
			parser.eatToken();

			if (!parseRegister(parser,reg2) || reg2.num < reg.num)
				return false;
			
			for (int i = reg.num; i <= reg2.num; i++)
			{
				dest |= (1 << i);
			}
		} else {
			dest |= (1 << reg.num);
		}

		if (parser.peekToken().type != TokenType::Comma)
			break;

		parser.eatToken();
	}

	return (validMask & dest) == dest;
}